

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

void kratos::check_active_high(Generator *top)

{
  undefined1 local_c8 [8];
  ActiveVisitor visitor;
  
  visitor.super_IRVisitor._8_8_ =
       &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
  visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  local_c8 = (undefined1  [8])&PTR_visit_root_002ab558;
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket =
       (__node_base_ptr)&visitor.reset_map_._M_h._M_rehash_policy._M_next_resize;
  visitor.reset_map_._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.reset_map_._M_h._M_bucket_count = 0;
  visitor.reset_map_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.reset_map_._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.reset_map_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.reset_map_._M_h._M_rehash_policy._4_4_ = 0;
  visitor.reset_map_._M_h._M_rehash_policy._M_next_resize = 0;
  visitor.reset_map_._M_h._M_single_bucket =
       (__node_base_ptr)&visitor.reset_stmt_._M_h._M_rehash_policy._M_next_resize;
  visitor.reset_stmt_._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.reset_stmt_._M_h._M_bucket_count = 0;
  visitor.reset_stmt_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.reset_stmt_._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.reset_stmt_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.reset_stmt_._M_h._M_rehash_policy._4_4_ = 0;
  visitor.reset_stmt_._M_h._M_rehash_policy._M_next_resize = 0;
  IRVisitor::visit_root_s((IRVisitor *)local_c8,&top->super_IRNode);
  ActiveVisitor::~ActiveVisitor((ActiveVisitor *)local_c8);
  return;
}

Assistant:

void check_active_high(Generator* top) {
    ActiveVisitor visitor;
    visitor.visit_root_s(top);
}